

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O2

LightLeSample * __thiscall
pbrt::UniformInfiniteLight::SampleLe
          (LightLeSample *__return_storage_ptr__,UniformInfiniteLight *this,Point2f *u1,Point2f *u2,
          SampledWavelengths *lambda,Float time)

{
  float fVar1;
  Float a;
  undefined1 auVar2 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar9 [56];
  undefined1 auVar3 [64];
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 auVar7 [64];
  float fVar11;
  undefined1 auVar12 [64];
  undefined1 auVar13 [64];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  Vector3f VVar16;
  Vector3f VVar17;
  Point3<float> PVar18;
  SampledSpectrum SVar19;
  Frame wFrame;
  float local_98;
  float fStack_94;
  SampledSpectrum local_88;
  undefined1 local_78 [16];
  Tuple3<pbrt::Vector3,_float> local_60;
  Frame local_54;
  undefined8 uVar8;
  undefined1 extraout_var [56];
  undefined1 auVar10 [56];
  
  local_88.values.values[3] = local_88.values.values[1];
  auVar9 = in_register_00001204._4_56_;
  VVar16 = SampleUniformSphere(u1);
  fVar11 = VVar16.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3._0_8_ = VVar16.super_Tuple3<pbrt::Vector3,_float>._0_8_;
  auVar3._8_56_ = auVar9;
  auVar14._0_8_ = auVar3._0_8_ ^ 0x8000000080000000;
  auVar14._8_4_ = -auVar9._0_4_;
  auVar14._12_4_ = -auVar9._4_4_;
  local_88.values.values._0_8_ = vmovlps_avx(auVar14);
  local_88.values.values[2] = -fVar11;
  Frame::FromZ(&local_54,(Vector3f *)&local_88);
  auVar4._0_8_ = SampleUniformDiskConcentric(u2);
  uVar8 = extraout_var._0_8_;
  auVar4._8_56_ = extraout_var;
  fVar1 = this->sceneRadius;
  local_60._0_8_ = vmovlps_avx(auVar4._0_16_);
  local_60.z = 0.0;
  VVar17 = Frame::FromLocal(&local_54,(Vector3f *)&local_60);
  auVar2._0_4_ = fVar1 * VVar17.super_Tuple3<pbrt::Vector3,_float>.x;
  auVar2._4_4_ = fVar1 * VVar17.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar2._8_4_ = fVar1 * (float)uVar8;
  auVar2._12_4_ = fVar1 * (float)((ulong)uVar8 >> 0x20);
  auVar10 = ZEXT856(auVar2._8_8_);
  uVar8 = vmovlps_avx(auVar2);
  local_88.values.values[2] = fVar1 * VVar17.super_Tuple3<pbrt::Vector3,_float>.z;
  local_88.values.values[0] = (float)(int)uVar8;
  local_88.values.values[1] = (float)(int)((ulong)uVar8 >> 0x20);
  PVar18 = Point3<float>::operator+(&this->sceneCenter,(Vector3<float> *)&local_88);
  auVar5._0_8_ = PVar18.super_Tuple3<pbrt::Point3,_float>._0_8_;
  auVar5._8_56_ = auVar10;
  fVar1 = this->sceneRadius;
  local_98 = VVar16.super_Tuple3<pbrt::Vector3,_float>.x;
  fStack_94 = VVar16.super_Tuple3<pbrt::Vector3,_float>.y;
  auVar15._0_4_ = fVar1 * local_98;
  auVar15._4_4_ = fVar1 * fStack_94;
  auVar15._8_4_ = fVar1 * auVar9._0_4_;
  auVar15._12_4_ = fVar1 * auVar9._4_4_;
  local_78 = vsubps_avx(auVar5._0_16_,auVar15);
  auVar10 = (undefined1  [56])0x0;
  a = this->scale;
  auVar9 = (undefined1  [56])0x0;
  SVar19 = DenselySampledSpectrum::Sample(&this->Lemit,lambda);
  auVar12._0_8_ = SVar19.values.values._8_8_;
  auVar12._8_56_ = auVar10;
  auVar6._0_8_ = SVar19.values.values._0_8_;
  auVar6._8_56_ = auVar9;
  local_88.values.values = (array<float,_4>)vmovlhps_avx(auVar6._0_16_,auVar12._0_16_);
  auVar9 = (undefined1  [56])0x0;
  SVar19 = SampledSpectrum::operator*(&local_88,a);
  auVar13._0_8_ = SVar19.values.values._8_8_;
  auVar13._8_56_ = auVar10;
  auVar7._0_8_ = SVar19.values.values._0_8_;
  auVar7._8_56_ = auVar9;
  auVar2 = vmovlhps_avx(auVar7._0_16_,auVar13._0_16_);
  *(undefined1 (*) [16])(__return_storage_ptr__->L).values.values = auVar2;
  uVar8 = vmovlps_avx(local_78);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.x = (float)(int)uVar8;
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.y =
       (float)(int)((ulong)uVar8 >> 0x20);
  (__return_storage_ptr__->ray).o.super_Tuple3<pbrt::Point3,_float>.z =
       PVar18.super_Tuple3<pbrt::Point3,_float>.z - fVar1 * fVar11;
  uVar8 = vmovlps_avx(auVar3._0_16_);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.x = (float)(int)uVar8;
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.y =
       (float)(int)((ulong)uVar8 >> 0x20);
  (__return_storage_ptr__->ray).d.super_Tuple3<pbrt::Vector3,_float>.z = fVar11;
  (__return_storage_ptr__->ray).time = time;
  (__return_storage_ptr__->ray).medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = 0;
  (__return_storage_ptr__->intr).set = false;
  __return_storage_ptr__->pdfPos = 1.0 / (fVar1 * fVar1 * 3.1415927);
  __return_storage_ptr__->pdfDir = 0.07957747;
  return __return_storage_ptr__;
}

Assistant:

LightLeSample UniformInfiniteLight::SampleLe(const Point2f &u1, const Point2f &u2,
                                             SampledWavelengths &lambda,
                                             Float time) const {
    Vector3f w = SampleUniformSphere(u1);
    // Compute infinite light sample ray
    Frame wFrame = Frame::FromZ(-w);
    Point2f cd = SampleUniformDiskConcentric(u2);
    Point3f pDisk = sceneCenter + sceneRadius * wFrame.FromLocal(Vector3f(cd.x, cd.y, 0));
    Ray ray(pDisk + sceneRadius * -w, w, time);

    // Compute probabilities for uniform infinite light
    Float pdfPos = 1 / (Pi * Sqr(sceneRadius));
    Float pdfDir = UniformSpherePDF();

    return LightLeSample(scale * Lemit.Sample(lambda), ray, pdfPos, pdfDir);
}